

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_log_init_conn_state(ptls_log_conn_state_t *state,_func_void_void_ptr_size_t *random_bytes)

{
  _func_void_void_ptr_size_t *__dest;
  float local_48;
  undefined8 local_44;
  undefined8 local_3c;
  undefined1 auStack_30 [20];
  uint local_1c;
  _func_void_void_ptr_size_t *p_Stack_18;
  uint32_t r;
  _func_void_void_ptr_size_t *random_bytes_local;
  ptls_log_conn_state_t *state_local;
  
  p_Stack_18 = random_bytes;
  random_bytes_local = (_func_void_void_ptr_size_t *)state;
  (*random_bytes)(&local_1c,4);
  __dest = random_bytes_local;
  local_48 = (float)local_1c / 4.2949673e+09;
  local_44 = _in6addr_any;
  local_3c = _EVP_aes_128_ecb;
  memset(auStack_30,0,0x10);
  memcpy(__dest,&local_48,0x28);
  return;
}

Assistant:

void ptls_log_init_conn_state(ptls_log_conn_state_t *state, void (*random_bytes)(void *, size_t))
{
    uint32_t r;
    random_bytes(&r, sizeof(r));

    *state = (ptls_log_conn_state_t){
        .random_ = (float)r / ((uint64_t)UINT32_MAX + 1), /* [0..1), so that any(r) < sample_ratio where sample_ratio is [0..1] */
        .address = in6addr_any,
    };
}